

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_abcd_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 src_00;
  TCGv_i32 dest_00;
  TCGv_i32 dest;
  TCGv_i32 src;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  gen_flush_flags(s);
  src_00 = gen_extend(s,tcg_ctx_00->cpu_dregs[(int)(insn & 7)],0,0);
  dest_00 = gen_extend(s,tcg_ctx_00->cpu_dregs[(int)((int)(uint)insn >> 9 & 7)],0,0);
  bcd_add(tcg_ctx_00,dest_00,src_00);
  gen_partset_reg(tcg_ctx_00,0,tcg_ctx_00->cpu_dregs[(int)((int)(uint)insn >> 9 & 7)],dest_00);
  bcd_flags(tcg_ctx_00,dest_00);
  return;
}

Assistant:

DISAS_INSN(abcd_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv dest;

    gen_flush_flags(s); /* !Z is sticky */

    src = gen_extend(s, DREG(insn, 0), OS_BYTE, 0);
    dest = gen_extend(s, DREG(insn, 9), OS_BYTE, 0);
    bcd_add(tcg_ctx, dest, src);
    gen_partset_reg(tcg_ctx, OS_BYTE, DREG(insn, 9), dest);

    bcd_flags(tcg_ctx, dest);
}